

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O2

ion_cursor_status_t oafdict_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  int iVar1;
  int iVar2;
  ion_dictionary_parent_t *piVar3;
  ion_err_t iVar4;
  char cVar5;
  ion_oafdict_cursor_t *oafdict_cursor;
  
  cVar5 = cursor->status;
  switch(cVar5) {
  case '\x01':
  case '\x03':
    goto switchD_00106084_caseD_1;
  case '\x02':
  case '\x04':
    piVar3 = cursor->dictionary->instance;
    iVar1 = (piVar3->record).key_size;
    iVar2 = (piVar3->record).value_size;
    if (cVar5 == '\x04') {
      iVar4 = oafdict_scan((ion_oafdict_cursor_t *)cursor);
      if (iVar4 == '\x01') {
        cursor->status = '\x01';
        return '\x01';
      }
    }
    else {
      cursor->status = '\x04';
    }
    fseek((FILE *)piVar3[1].compare,
          (long)(iVar1 + iVar2 + 1) * (long)*(int *)&cursor[1].field_0x4 + 1,0);
    fread(record->key,(long)(piVar3->record).key_size,1,(FILE *)piVar3[1].compare);
    fread(record->value,(long)(piVar3->record).value_size,1,(FILE *)piVar3[1].compare);
    cVar5 = cursor->status;
switchD_00106084_caseD_1:
    return cVar5;
  default:
    return '\0';
  }
}

Assistant:

ion_cursor_status_t
oafdict_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_oafdict_cursor_t *oafdict_cursor = (ion_oafdict_cursor_t *) cursor;

	/* check the status of the cursor and if it is not valid or at the end, just exit */
	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		/* cursor is active and results have never been accessed */
		/* extract reference to map */
		ion_file_hashmap_t *hash_map = ((ion_file_hashmap_t *) cursor->dictionary->instance);

		/* assume that the value has been pre-allocated */
		/* compute length of data record stored in map */
		int data_length = hash_map->super.record.key_size + hash_map->super.record.value_size;

		if (cursor->status == cs_cursor_active) {
			/* find the next valid entry */

			/* scan and determine what to do? */
			if (cs_end_of_results == oafdict_scan(oafdict_cursor)) {
				/* Then this is the end and there are no more results */
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
		}
		else {
			/* if the cursor is initialized but not active, then just read the data and set cursor active */
			cursor->status = cs_cursor_active;
		}

		/* the results are now ready //reference item at given position */

		/* set position in file to read value */
		fseek(hash_map->file, (SIZEOF(STATUS) + data_length) * oafdict_cursor->current	/* position is based on indexes (not abs file pos) */
			+ SIZEOF(STATUS), SEEK_SET);

		fread(record->key, hash_map->super.record.key_size, 1, hash_map->file);
		fread(record->value, hash_map->super.record.value_size, 1, hash_map->file);

		/* and update current cursor position */
		return cursor->status;
	}

	/* and if you get this far, the cursor is invalid */
	return cs_invalid_cursor;
}